

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  string local_40;
  Var *local_20;
  Var *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (Var *)name.data_;
  local_20 = this;
  string_view::to_string_abi_cxx11_(&local_40,(string_view *)&this_local);
  set_name(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Var::set_name(string_view name) {
  set_name(name.to_string());
}